

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

int * Cudd_VectorSupportIndex(DdManager *dd,DdNode **F,int n)

{
  int local_3c;
  int local_34;
  int size;
  int i;
  int *support;
  int n_local;
  DdNode **F_local;
  DdManager *dd_local;
  
  if (dd->size < dd->sizeZ) {
    local_3c = dd->sizeZ;
  }
  else {
    local_3c = dd->size;
  }
  dd_local = (DdManager *)malloc((long)local_3c << 2);
  if (dd_local == (DdManager *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    dd_local = (DdManager *)0x0;
  }
  else {
    for (local_34 = 0; local_34 < local_3c; local_34 = local_34 + 1) {
      (&(dd_local->sentinel).index)[local_34] = 0;
    }
    for (local_34 = 0; local_34 < n; local_34 = local_34 + 1) {
      ddSupportStep((DdNode *)((ulong)F[local_34] & 0xfffffffffffffffe),(int *)dd_local);
    }
    for (local_34 = 0; local_34 < n; local_34 = local_34 + 1) {
      ddClearFlag((DdNode *)((ulong)F[local_34] & 0xfffffffffffffffe));
    }
  }
  return (int *)dd_local;
}

Assistant:

int *
Cudd_VectorSupportIndex(
  DdManager * dd /* manager */,
  DdNode ** F /* array of DDs whose support is sought */,
  int  n /* size of the array */)
{
    int *support;
    int i;
    int size;

    /* Allocate and initialize support array for ddSupportStep. */
    size = ddMax(dd->size, dd->sizeZ);
    support = ABC_ALLOC(int,size);
    if (support == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < size; i++) {
        support[i] = 0;
    }

    /* Compute support and clean up markers. */
    for (i = 0; i < n; i++) {
        ddSupportStep(Cudd_Regular(F[i]),support);
    }
    for (i = 0; i < n; i++) {
        ddClearFlag(Cudd_Regular(F[i]));
    }

    return(support);

}